

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

string_type * __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render(string_type *__return_storage_ptr__,
      basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *ctx)

{
  anon_class_8_1_3fcf671e local_1c0;
  render_handler local_1b8;
  ostringstream local_198 [8];
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ss;
  context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ctx_local;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1c0.ss = (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_198;
  std::function<void(std::__cxx11::string_const&)>::
  function<kainjow::mustache::basic_mustache<std::__cxx11::string>::render(kainjow::mustache::context_internal<std::__cxx11::string>&)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_1b8,&local_1c0);
  render(this,&local_1b8,ctx,true);
  Catch::clara::std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

string_type render(context_internal<string_type>& ctx) {
        std::basic_ostringstream<typename string_type::value_type> ss;
        render([&ss](const string_type& str) {
            ss << str;
        }, ctx);
        return ss.str();
    }